

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::DecompressPiz
               (uchar *outPtr,uchar *inPtr,size_t tmpBufSize,int num_channels,
               EXRChannelInfo *channels,int data_width,int num_lines)

{
  long *plVar1;
  size_t __n;
  ushort uVar2;
  size_t sVar3;
  unsigned_short uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ushort *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  pointer pPVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  pointer pPVar16;
  ushort uVar17;
  uchar *__dest;
  short sVar18;
  unsigned_short *puVar19;
  ushort *puVar20;
  long lVar21;
  short hs;
  short sVar22;
  ushort uVar23;
  int *piVar24;
  size_type __n_00;
  int *piVar25;
  bool bVar26;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  uchar bitmap [8192];
  unsigned_short lut [65536];
  allocator_type aStack_22131;
  long lStack_22130;
  int iStack_22128;
  int iStack_22124;
  uchar *puStack_22120;
  long lStack_22118;
  uint uStack_2210c;
  uint uStack_22108;
  int iStack_22104;
  size_t sStack_22100;
  pointer pPStack_220f8;
  long lStack_220f0;
  ushort *puStack_220e8;
  long lStack_220e0;
  ulong uStack_220d8;
  long lStack_220d0;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> vStack_220c8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vStack_220b0;
  pointer pPStack_22098;
  unsigned_short *puStack_22090;
  ulong uStack_22088;
  long lStack_22080;
  long lStack_22078;
  long lStack_22070;
  ulong uStack_22068;
  long lStack_22060;
  long lStack_22058;
  ushort *puStack_22050;
  long lStack_22048;
  ushort *puStack_22040;
  uchar auStack_22038 [8192];
  unsigned_short auStack_20038 [65540];
  
  sStack_22100 = tmpBufSize;
  memset(auStack_22038,0,0x2000);
  uVar2 = *(ushort *)(inPtr + 2);
  uStack_22088 = (ulong)uVar2;
  uVar13 = (uint)uVar2;
  if (0x1fff < uStack_22088) {
LAB_00126e4b:
    return uVar13 < 0x2000;
  }
  uVar17 = *(ushort *)inPtr;
  piVar25 = (int *)(inPtr + 4);
  puStack_22120 = outPtr;
  if (uVar17 <= uVar2) {
    lVar14 = uStack_22088 - uVar17;
    memcpy(auStack_22038 + uVar17,piVar25,lVar14 + 1);
    piVar25 = (int *)((long)piVar25 + lVar14 + 1);
  }
  memset(auStack_20038,0,0x20000);
  uVar4 = reverseLutFromBitmap(auStack_22038,auStack_20038);
  sVar3 = sStack_22100;
  iVar7 = *piVar25;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&vStack_220b0,sStack_22100,(allocator_type *)&vStack_220c8);
  if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    hufUncompress((char *)(piVar25 + 1),iVar7,
                  vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start,(int)sVar3);
    __n_00 = (size_type)num_channels;
    std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
              (&vStack_220c8,__n_00,&aStack_22131);
    if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if (num_channels != 0) {
        piVar24 = &channels->pixel_type;
        piVar25 = &(vStack_220c8.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start)->size;
        puVar19 = vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar7 = *piVar24;
          ((PIZChannelData *)(piVar25 + -7))->start = puVar19;
          *(unsigned_short **)(piVar25 + -5) = puVar19;
          piVar25[-3] = data_width;
          piVar25[-2] = num_lines;
          *piVar25 = (iVar7 != 1) + 1;
          puVar19 = puVar19 + (num_lines * data_width << (iVar7 != 1));
          piVar24 = piVar24 + 0x44;
          piVar25 = piVar25 + 8;
          __n_00 = __n_00 - 1;
        } while (__n_00 != 0);
      }
      puStack_22090 =
           vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
      pPStack_22098 =
           vStack_220c8.
           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if ((long)vStack_220c8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vStack_220c8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lStack_22080 = (long)vStack_220c8.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vStack_220c8.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
        lStack_22080 = lStack_22080 + (ulong)(lStack_22080 == 0);
        pPStack_220f8 =
             vStack_220c8.
             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
             _M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0;
        do {
          lStack_22078 = lVar14;
          iVar7 = vStack_220c8.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start[lStack_22078].size;
          lStack_22130 = (long)iVar7;
          if (0 < lStack_22130) {
            pPVar16 = vStack_220c8.
                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                      ._M_impl.super__Vector_impl_data._M_start + lStack_22078;
            puVar19 = pPVar16->start;
            uVar13 = pPVar16->nx;
            uStack_22108 = pPVar16->ny;
            iStack_22128 = uVar13 * iVar7;
            uStack_2210c = uStack_22108;
            if ((int)uVar13 < (int)uStack_22108) {
              uStack_2210c = uVar13;
            }
            lStack_220f0 = 0;
            lStack_22118 = 0;
            do {
              uVar6 = 1;
              do {
                uVar5 = uVar6;
                uVar6 = uVar5 * 2;
              } while ((int)uVar5 <= (int)uStack_2210c);
              if (0 < (int)uVar5 >> 2) {
                puStack_220e8 = puVar19 + lStack_22118;
                uVar9 = (ulong)(uVar5 >> 1);
                uVar6 = (int)uVar5 >> 2;
                do {
                  iStack_22124 = (int)uVar9;
                  iVar12 = (uStack_22108 - iStack_22124) * iStack_22128;
                  uStack_220d8 = (ulong)(uVar6 * iVar7);
                  lStack_220e0 = (long)(iStack_22124 * iVar7);
                  puVar8 = puStack_220e8;
                  if (-1 < iVar12) {
                    puStack_22050 = puStack_220e8 + iVar12;
                    iStack_22104 = (uVar13 - iStack_22124) * iVar7;
                    lStack_22070 = (long)iStack_22104;
                    lStack_220d0 = (long)(int)(uVar6 * iStack_22128);
                    lStack_22058 = (long)(iStack_22124 * iStack_22128);
                    lStack_22060 = lStack_22058 * 2;
                    lVar14 = uStack_220d8 * 2 + lStack_220d0 * 2;
                    lVar21 = lStack_220f0;
                    do {
                      puVar20 = puVar8;
                      if (-1 < iStack_22104) {
                        lVar15 = lVar21;
                        do {
                          uVar2 = *(ushort *)((long)puVar19 + lVar15 + lStack_220d0 * 2);
                          if (uVar4 < 0x4000) {
                            sVar18 = ((short)uVar2 >> 1) +
                                     *(short *)((long)puVar19 + lVar15) + (uVar2 & 1);
                            uVar17 = *(ushort *)((long)puVar19 + lVar15 + lVar14);
                            uVar23 = ((short)uVar17 >> 1) +
                                     (uVar17 & 1) +
                                     *(short *)((long)puVar19 + lVar15 + uStack_220d8 * 2);
                            sVar22 = ((short)uVar23 >> 1) + (uVar23 & 1) + sVar18;
                            *(short *)((long)puVar19 + lVar15) = sVar22;
                            uVar17 = uVar23 - uVar17;
                            *(ushort *)((long)puVar19 + lVar15 + uStack_220d8 * 2) = sVar22 - uVar23
                            ;
                            sVar18 = ((short)uVar17 >> 1) + (uVar17 & 1) + (sVar18 - uVar2);
                            *(short *)((long)puVar19 + lVar15 + lStack_220d0 * 2) = sVar18;
                            *(ushort *)((long)puVar19 + lVar15 + lVar14) = sVar18 - uVar17;
                          }
                          else {
                            sVar18 = *(short *)((long)puVar19 + lVar15) - (uVar2 >> 1);
                            uVar17 = *(ushort *)((long)puVar19 + lVar15 + lVar14);
                            uVar23 = *(short *)((long)puVar19 + lVar15 + uStack_220d8 * 2) -
                                     (uVar17 >> 1);
                            uVar17 = uVar17 + uVar23 ^ 0x8000;
                            sVar22 = (sVar18 + uVar2 ^ 0x8000) - (uVar17 >> 1);
                            *(short *)((long)puVar19 + lVar15 + uStack_220d8 * 2) = sVar22;
                            *(ushort *)((long)puVar19 + lVar15) = sVar22 + uVar17 ^ 0x8000;
                            sVar18 = sVar18 - (uVar23 >> 1);
                            *(short *)((long)puVar19 + lVar15 + lVar14) = sVar18;
                            *(ushort *)((long)puVar19 + lVar15 + lStack_220d0 * 2) =
                                 sVar18 + uVar23 ^ 0x8000;
                          }
                          lVar15 = lVar15 + lStack_220e0 * 2;
                          puVar20 = (ushort *)((long)puVar19 + lVar15);
                          lStack_22048 = lVar21;
                          puStack_22040 = puVar8;
                        } while (puVar20 <= puVar8 + lStack_22070);
                      }
                      if ((uVar13 & uVar6) != 0) {
                        uVar2 = puVar20[lStack_220d0];
                        if (uVar4 < 0x4000) {
                          uVar23 = ((short)uVar2 >> 1) + *puVar20 + (uVar2 & 1);
                          uVar17 = uVar23 - uVar2;
                        }
                        else {
                          uVar17 = *puVar20 - (uVar2 >> 1);
                          uVar23 = uVar17 + uVar2 ^ 0x8000;
                        }
                        puVar20[lStack_220d0] = uVar17;
                        *puVar20 = uVar23;
                      }
                      puVar8 = puVar8 + lStack_22058;
                      lVar21 = lVar21 + lStack_22060;
                      uStack_22068 = (ulong)uVar6;
                    } while (puVar8 <= puStack_22050);
                  }
                  if (((uVar6 & uStack_22108) != 0) &&
                     (iVar12 = (uVar13 - iStack_22124) * iVar7, -1 < iVar12)) {
                    puVar20 = puVar8 + iVar12;
                    do {
                      uVar2 = puVar8[uStack_220d8];
                      if (uVar4 < 0x4000) {
                        uVar23 = ((short)uVar2 >> 1) + *puVar8 + (uVar2 & 1);
                        uVar17 = uVar23 - uVar2;
                      }
                      else {
                        uVar17 = *puVar8 - (uVar2 >> 1);
                        uVar23 = uVar17 + uVar2 ^ 0x8000;
                      }
                      puVar8[uStack_220d8] = uVar17;
                      *puVar8 = uVar23;
                      puVar8 = puVar8 + lStack_220e0;
                    } while (puVar8 <= puVar20);
                  }
                  bVar26 = 1 < uVar6;
                  uVar9 = (ulong)uVar6;
                  uVar6 = uVar6 >> 1;
                } while (bVar26);
              }
              lStack_22118 = lStack_22118 + 1;
              lStack_220f0 = lStack_220f0 + 2;
            } while (lStack_22118 != lStack_22130);
          }
          lVar14 = lStack_22078 + 1;
        } while (lStack_22078 + 1 != lStack_22080);
      }
      if (0 < (int)(uint)sStack_22100) {
        uVar9 = 0;
        do {
          vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               auStack_20038
               [vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar9]];
          uVar9 = uVar9 + 1;
        } while (((uint)sStack_22100 & 0x7fffffff) != uVar9);
      }
      pPVar16 = vStack_220c8.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < num_lines) {
        iVar7 = 0;
        pPVar11 = vStack_220c8.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          bVar26 = pPVar11 != pPVar16;
          pPVar11 = pPVar16;
          __dest = puStack_22120;
          if (bVar26) {
            lVar14 = 8;
            uVar9 = 0;
            do {
              lVar21 = (long)*(int *)((long)&pPVar16->ny + lVar14) *
                       (long)*(int *)((long)&pPVar16->end + lVar14);
              __n = lVar21 * 2;
              memcpy(__dest,*(void **)((long)&pPVar16->start + lVar14),__n);
              __dest = __dest + lVar21 * 2;
              plVar1 = (long *)((long)&pPVar16->start + lVar14);
              *plVar1 = *plVar1 + __n;
              uVar9 = uVar9 + 1;
              lVar14 = lVar14 + 0x20;
              pPVar11 = vStack_220c8.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pPVar16 = vStack_220c8.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar9 < (ulong)((long)vStack_220c8.
                                           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vStack_220c8.
                                           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          iVar7 = iVar7 + 1;
          puStack_22120 = __dest;
        } while (iVar7 != num_lines);
      }
      if (pPVar16 != (pointer)0x0) {
        operator_delete(pPVar16,(long)vStack_220c8.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pPVar16);
      }
      uVar13 = (uint)uStack_22088;
      if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
        operator_delete(vStack_220b0.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_220b0.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_220b0.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00126e4b;
    }
  }
  uVar10 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  if (vStack_220c8.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_220c8.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_220c8.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_220c8.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(vStack_220b0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_220b0.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_220b0.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar10);
}

Assistant:

bool DecompressPiz(unsigned char *outPtr, const unsigned char *inPtr,
                   size_t tmpBufSize, int num_channels,
                   const EXRChannelInfo *channels, int data_width,
                   int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  memset(bitmap, 0, BITMAP_SIZE);

  const unsigned char *ptr = inPtr;
  minNonZero = *(reinterpret_cast<const unsigned short *>(ptr));
  maxNonZero = *(reinterpret_cast<const unsigned short *>(ptr + 2));
  ptr += 4;

  if (maxNonZero >= BITMAP_SIZE) {
    return false;
  }

  if (minNonZero <= maxNonZero) {
    memcpy((char *)&bitmap[0] + minNonZero, ptr, maxNonZero - minNonZero + 1);
    ptr += maxNonZero - minNonZero + 1;
  }

  unsigned short lut[USHORT_RANGE];
  memset(lut, 0, sizeof(unsigned short) * USHORT_RANGE);
  unsigned short maxValue = reverseLutFromBitmap(bitmap, lut);

  //
  // Huffman decoding
  //

  int length;

  length = *(reinterpret_cast<const int *>(ptr));
  ptr += sizeof(int);

  std::vector<unsigned short> tmpBuffer(tmpBufSize);
  hufUncompress(reinterpret_cast<const char *>(ptr), length, &tmpBuffer.at(0),
                tmpBufSize);

  //
  // Wavelet decoding
  //

  std::vector<PIZChannelData> channelData(num_channels);

  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t i = 0; i < static_cast<size_t>(num_channels); ++i) {
    const EXRChannelInfo &chan = channels[i];

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (chan.pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    channelData[i].start = tmpBufferEnd;
    channelData[i].end = channelData[i].start;
    channelData[i].nx = data_width;
    channelData[i].ny = num_lines;
    // channelData[i].ys = 1;
    channelData[i].size = pixelSize / sizeof(short);

    tmpBufferEnd += channelData[i].nx * channelData[i].ny * channelData[i].size;
  }

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Decode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Expand the pixel data to their original range
  //

  applyLut(lut, &tmpBuffer.at(0), tmpBufSize);

  for (int y = 0; y < num_lines; y++) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(outPtr, cd.end, n * sizeof(unsigned short));
      outPtr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  return true;
}